

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_get_response(mg_connection *conn,char *ebuf,size_t ebuf_len,int timeout)

{
  char *pcVar1;
  int iVar2;
  mg_domain_context *pmVar3;
  uint uVar4;
  char *buf;
  int err;
  char txt [32];
  int local_5c;
  char local_58 [40];
  
  if (ebuf_len != 0) {
    *ebuf = '\0';
  }
  if (conn == (mg_connection *)0x0) {
    mg_snprintf((mg_connection *)0x0,(int *)0x0,ebuf,ebuf_len,"%s","Parameter error");
    uVar4 = 0xffffffff;
  }
  else {
    conn->data_len = 0;
    pmVar3 = conn->dom_ctx;
    pcVar1 = pmVar3->config[0xb];
    if (timeout < 0) {
      buf = (char *)0x0;
    }
    else {
      buf = local_58;
      mg_snprintf(conn,(int *)0x0,buf,0x20,"%i");
      pmVar3 = conn->dom_ctx;
    }
    pmVar3->config[0xb] = buf;
    iVar2 = get_response(conn,ebuf,ebuf_len,&local_5c);
    conn->dom_ctx->config[0xb] = pcVar1;
    pcVar1 = (conn->request_info).request_uri;
    (conn->request_info).local_uri_raw = pcVar1;
    (conn->request_info).local_uri = pcVar1;
    uVar4 = -(uint)(iVar2 == 0) | 1;
  }
  return uVar4;
}

Assistant:

CIVETWEB_API int
mg_get_response(struct mg_connection *conn,
                char *ebuf,
                size_t ebuf_len,
                int timeout)
{
	int err, ret;
	char txt[32]; /* will not overflow */
	char *save_timeout;
	char *new_timeout;

	if (ebuf_len > 0) {
		ebuf[0] = '\0';
	}

	if (!conn) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Parameter error");
		return -1;
	}

	/* Reset the previous responses */
	conn->data_len = 0;

	/* Implementation of API function for HTTP clients */
	save_timeout = conn->dom_ctx->config[REQUEST_TIMEOUT];

	if (timeout >= 0) {
		mg_snprintf(conn, NULL, txt, sizeof(txt), "%i", timeout);
		new_timeout = txt;
	} else {
		new_timeout = NULL;
	}

	conn->dom_ctx->config[REQUEST_TIMEOUT] = new_timeout;
	ret = get_response(conn, ebuf, ebuf_len, &err);
	conn->dom_ctx->config[REQUEST_TIMEOUT] = save_timeout;

	/* TODO: here, the URI is the http response code */
	conn->request_info.local_uri_raw = conn->request_info.request_uri;
	conn->request_info.local_uri = conn->request_info.local_uri_raw;

	/* TODO (mid): Define proper return values - maybe return length?
	 * For the first test use <0 for error and >0 for OK */
	return (ret == 0) ? -1 : +1;
}